

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* __thiscall
vkt::shaderexecutor::
generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *__return_storage_ptr__,shaderexecutor *this,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,deUint32 seed
          )

{
  size_t *this_00;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference in0_00;
  reference in1_00;
  reference in2_00;
  reference in3_00;
  undefined4 uVar4;
  float in_register_00000084;
  float afVar5 [2];
  undefined1 local_17c [8];
  InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  tuple_1;
  undefined1 local_158 [3];
  In3 in3;
  In2 in2;
  In1 in1;
  In0 in0;
  size_t ndx;
  undefined1 local_124 [8];
  InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  tuple;
  size_t ndx3;
  size_t ndx2;
  size_t ndx1;
  size_t ndx0;
  undefined1 local_d8 [8];
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  seenInputs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  fixedInputs;
  Random rnd;
  deUint32 seed_local;
  size_t numSamples_local;
  Precision intPrecision_local;
  FloatFormat *floatFormat_local;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *samplings_local;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *ret;
  
  afVar5[1] = in_register_00000084;
  afVar5[0] = (float)intPrecision;
  uVar4 = SUB84(floatFormat,0);
  de::Random::Random((Random *)
                     ((long)&fixedInputs.in3.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     (deUint32)numSamples);
  fixedInputs.in3.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::Inputs(__return_storage_ptr__);
  this_00 = &seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::Inputs((Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *)this_00);
  std::
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  ::set((set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
         *)local_d8);
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings,this_00);
  (**(code **)**(undefined8 **)(this + 8))
            (*(undefined8 **)(this + 8),samplings,
             &fixedInputs.in0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (**(code **)**(undefined8 **)(this + 0x10))
            (*(undefined8 **)(this + 0x10),samplings,
             &fixedInputs.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (**(code **)**(undefined8 **)(this + 0x18))
            (*(undefined8 **)(this + 0x18),samplings,
             &fixedInputs.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (ndx1 = 0;
      sVar3 = std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
              size((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_> *)
                   &seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count), ndx1 < sVar3;
      ndx1 = ndx1 + 1) {
    for (ndx2 = 0;
        sVar3 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
                size((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      *)&fixedInputs.in0.
                         super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), ndx2 < sVar3;
        ndx2 = ndx2 + 1) {
      for (ndx3 = 0;
          sVar3 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::size((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&fixedInputs.in1.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), ndx3 < sVar3;
          ndx3 = ndx3 + 1) {
        tuple.
        super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
        .a.m_data.m_data[2].m_data[1] = 0.0;
        tuple.
        super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
        ._24_4_ = 0;
        for (; uVar1 = tuple.
                       super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                       ._20_8_,
            sVar3 = std::
                    vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
                    size((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&fixedInputs.in2.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
            (ulong)uVar1 < sVar3;
            tuple.
            super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
            ._20_8_ = tuple.
                      super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                      ._20_8_ + 1) {
          in0_00 = std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                   ::operator[]((vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                 *)&seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count,ndx1
                               );
          in1_00 = std::
                   vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
                   operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                               *)&fixedInputs.in0.
                                  super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,ndx2);
          in2_00 = std::
                   vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
                   operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                               *)&fixedInputs.in1.
                                  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,ndx3);
          in3_00 = std::
                   vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
                   operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                               *)&fixedInputs.in2.
                                  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              tuple.
                              super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                              ._20_8_);
          InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          ::InTuple((InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                     *)local_124,in0_00,in1_00,in2_00,in3_00);
          std::
          set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
          ::insert((set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
                    *)local_d8,(value_type *)local_124);
          std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::
          push_back(&__return_storage_ptr__->in0,(value_type *)local_124);
          std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
          push_back(&__return_storage_ptr__->in1,
                    (value_type *)
                    (tuple.
                     super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                     .a.m_data.m_data + 2));
          std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
          push_back(&__return_storage_ptr__->in2,
                    (value_type *)
                    ((long)tuple.
                           super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                           .a.m_data.m_data[2].m_data + 1));
          std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
          push_back(&__return_storage_ptr__->in3,
                    (value_type *)
                    ((long)tuple.
                           super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                           .a.m_data.m_data[2].m_data + 2));
          InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          ::~InTuple((InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                      *)local_124);
        }
      }
    }
  }
  in0.m_data.m_data[2].m_data[0] = 0.0;
  in0.m_data.m_data[2].m_data[1] = 0.0;
  for (; (ulong)in0.m_data.m_data[2].m_data < (ulong)afVar5;
      in0.m_data.m_data[2].m_data = in0.m_data.m_data[2].m_data + 1) {
    (**(code **)(**(long **)this + 8))
              (local_158,*(long **)this,samplings,uVar4,
               (undefined1 *)
               ((long)&fixedInputs.in3.
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    (**(code **)(**(long **)(this + 8) + 8))
              (*(long **)(this + 8),samplings,uVar4,
               (undefined1 *)
               ((long)&fixedInputs.in3.
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    (**(code **)(**(long **)(this + 0x10) + 8))
              (*(long **)(this + 0x10),samplings,uVar4,
               (undefined1 *)
               ((long)&fixedInputs.in3.
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    (**(code **)(**(long **)(this + 0x18) + 8))
              (*(long **)(this + 0x18),samplings,uVar4,
               (undefined1 *)
               ((long)&fixedInputs.in3.
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::InTuple((InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
               *)local_17c,(In0 *)local_158,
              (In1 *)&tuple_1.
                      super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                      .field_0x1b,
              (In2 *)&tuple_1.
                      super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                      .field_0x19,
              (In3 *)((long)tuple_1.
                            super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                            .a.m_data.m_data[2].m_data + 7));
    bVar2 = de::
            contains<std::set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>>
                      ((set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
                        *)local_d8,(key_type *)local_17c);
    if (!bVar2) {
      std::
      set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
      ::insert((set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
                *)local_d8,(value_type *)local_17c);
      std::vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>::push_back
                (&__return_storage_ptr__->in0,(value_type *)local_158);
      std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::push_back
                (&__return_storage_ptr__->in1,
                 (value_type *)
                 &tuple_1.
                  super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                  .field_0x1b);
      std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::push_back
                (&__return_storage_ptr__->in2,
                 (value_type *)
                 &tuple_1.
                  super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                  .field_0x19);
      std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::push_back
                (&__return_storage_ptr__->in3,
                 (value_type *)
                 ((long)tuple_1.
                        super_Tuple4<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                        .a.m_data.m_data[2].m_data + 7));
    }
    InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::~InTuple((InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                *)local_17c);
    tcu::Matrix<float,_2,_3>::~Matrix((Matrix<float,_2,_3> *)local_158);
  }
  fixedInputs.in3.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  ::~set((set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
          *)local_d8);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs((Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *)&seenInputs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((fixedInputs.in3.
       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::~Inputs(__return_storage_ptr__);
  }
  de::Random::~Random((Random *)
                      ((long)&fixedInputs.in3.
                              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   deUint32				seed)
{
	Random										rnd(seed);
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}